

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8_t * __thiscall
google::protobuf::EnumDescriptorProto::_InternalSerialize
          (EnumDescriptorProto *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  EnumOptions *value;
  size_t __n;
  bool bVar2;
  anon_union_104_1_493b367e_for_EnumDescriptorProto_3 aVar3;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>_>
  *value_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto_EnumReservedRange>_>
  *value_01;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar4;
  uint8_t *puVar5;
  byte *pbVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 *puVar9;
  int iVar10;
  char *in_R9;
  string_view field_name;
  string_view field_name_00;
  string_view s;
  string_view s_00;
  
  aVar3 = this->field_0;
  if (((undefined1  [104])aVar3 & (undefined1  [104])0x1) != (undefined1  [104])0x0) {
    puVar9 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)"google.protobuf.EnumDescriptorProto.name";
    internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar9,(char *)(ulong)*(uint *)(puVar9 + 1),1,0x28,field_name);
    s._M_str = (char *)*puVar9;
    s._M_len = puVar9[1];
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,s,target);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x10);
  if (iVar1 != 0) {
    iVar10 = 0;
    do {
      value_00 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                           (&(this->field_0)._impl_.value_.super_RepeatedPtrFieldBase,iVar10);
      target = internal::WireFormatLite::InternalWriteMessage
                         (2,(MessageLite *)value_00,(value_00->field_0)._impl_._cached_size_.atom_,
                          target,stream);
      iVar10 = iVar10 + 1;
    } while (iVar1 != iVar10);
  }
  if (((undefined1  [104])aVar3 & (undefined1  [104])0x2) != (undefined1  [104])0x0) {
    value = (this->field_0)._impl_.options_;
    target = internal::WireFormatLite::InternalWriteMessage
                       (3,(MessageLite *)value,(value->field_0)._impl_._cached_size_.atom_,target,
                        stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x28);
  if (iVar1 != 0) {
    iVar10 = 0;
    do {
      value_01 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto_EnumReservedRange>>
                           (&(this->field_0)._impl_.reserved_range_.super_RepeatedPtrFieldBase,
                            iVar10);
      target = internal::WireFormatLite::InternalWriteMessage
                         (4,(MessageLite *)value_01,(value_01->field_0)._impl_._cached_size_.atom_,
                          target,stream);
      iVar10 = iVar10 + 1;
    } while (iVar1 != iVar10);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x40);
  if (0 < iVar1) {
    iVar10 = 0;
    do {
      pVVar4 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         (&(this->field_0)._impl_.reserved_name_.super_RepeatedPtrFieldBase,iVar10);
      field_name_00._M_str = in_R9;
      field_name_00._M_len = (size_t)"google.protobuf.EnumDescriptorProto.reserved_name";
      internal::WireFormatLite::VerifyUtf8String
                ((WireFormatLite *)(pVVar4->_M_dataplus)._M_p,
                 (char *)(ulong)(uint)pVVar4->_M_string_length,1,0x31,field_name_00);
      __n = pVVar4->_M_string_length;
      if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)target)))) {
        *target = 0x2a;
        target[1] = (byte)__n;
        memcpy(target + 2,(pVVar4->_M_dataplus)._M_p,__n);
        target = target + __n + 2;
      }
      else {
        s_00._M_str = (pVVar4->_M_dataplus)._M_p;
        s_00._M_len = __n;
        target = io::EpsCopyOutputStream::WriteStringOutline(stream,5,s_00,target);
      }
      iVar10 = iVar10 + 1;
    } while (iVar1 != iVar10);
  }
  if (((undefined1  [104])aVar3 & (undefined1  [104])0x4) != (undefined1  [104])0x0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar7 = (ulong)(this->field_0)._impl_.visibility_;
    pbVar6 = target + 1;
    *target = 0x30;
    uVar8 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar6 = (byte)uVar8 | 0x80;
        uVar7 = uVar8 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar2 = 0x3fff < uVar8;
        uVar8 = uVar7;
      } while (bVar2);
    }
    *pbVar6 = (byte)uVar7;
    target = pbVar6 + 1;
  }
  uVar8 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar8 & 1) != 0) {
    puVar5 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar8 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar5;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL EnumDescriptorProto::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const EnumDescriptorProto& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.EnumDescriptorProto)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional string name = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_name();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.EnumDescriptorProto.name");
    target = stream->WriteStringMaybeAliased(1, _s, target);
  }

  // repeated .google.protobuf.EnumValueDescriptorProto value = 2;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_value_size());
       i < n; i++) {
    const auto& repfield = this_._internal_value().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            2, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // optional .google.protobuf.EnumOptions options = 3;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        3, *this_._impl_.options_, this_._impl_.options_->GetCachedSize(), target,
        stream);
  }

  // repeated .google.protobuf.EnumDescriptorProto.EnumReservedRange reserved_range = 4;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_reserved_range_size());
       i < n; i++) {
    const auto& repfield = this_._internal_reserved_range().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            4, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated string reserved_name = 5;
  for (int i = 0, n = this_._internal_reserved_name_size(); i < n; ++i) {
    const auto& s = this_._internal_reserved_name().Get(i);
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(s.data(), static_cast<int>(s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.EnumDescriptorProto.reserved_name");
    target = stream->WriteString(5, s, target);
  }

  // optional .google.protobuf.SymbolVisibility visibility = 6;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        6, this_._internal_visibility(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.EnumDescriptorProto)
  return target;
}